

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertySkipEntry(char **ppPos,char *pEnd)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pbVar2 = (byte *)*ppPos;
  if (*pbVar2 == 0x22) {
    pbVar2 = pbVar2 + 1;
    do {
      pbVar3 = pbVar2;
      if (pEnd <= pbVar2) break;
      pbVar3 = pbVar2 + 1;
      bVar1 = *pbVar2;
      pbVar2 = pbVar3;
    } while (bVar1 != 0x22);
  }
  else {
    pbVar3 = pbVar2;
    if (pbVar2 < pEnd) {
      while( true ) {
        bVar1 = *pbVar2;
        pbVar3 = pbVar2;
        if ((((ulong)bVar1 < 0x3c) && ((0xc00030100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
           (bVar1 == 0x7b)) break;
        if ((bVar1 == 0x7d) || (pbVar2 = pbVar2 + 1, pbVar3 = (byte *)pEnd, pbVar2 == (byte *)pEnd))
        break;
      }
    }
  }
  *ppPos = (char *)pbVar3;
  return (int)(pbVar3 == (byte *)pEnd);
}

Assistant:

static inline int Scl_LibertySkipEntry( char ** ppPos, char * pEnd )
{
    char * pPos = *ppPos;
    if ( *pPos == '\"' )
    {
        for ( pPos++; pPos < pEnd; pPos++ )
            if ( *pPos == '\"' )
            {
                pPos++;
                break;
            }
    }
    else
    {
        for ( ; pPos < pEnd; pPos++ )
            if ( *pPos == ' ' || *pPos == '\r' || *pPos == '\n' || *pPos == '\t' ||
                 *pPos == ':' || *pPos == ';'  || 
                 *pPos == '(' || *pPos == ')'  || 
                 *pPos == '{' || *pPos == '}' )
                break;
    }
    *ppPos = pPos;
    return pPos == pEnd;
}